

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O1

bool duckdb::ArrayToVarcharCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  unsigned_long *puVar2;
  data_ptr_t index;
  Vector *this;
  ulong *puVar3;
  uint *puVar4;
  data_ptr_t extraout_RDX;
  data_ptr_t len;
  data_ptr_t extraout_RDX_00;
  data_ptr_t extraout_RDX_01;
  data_ptr_t extraout_RDX_02;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong idx;
  Vector *vector;
  ulong uVar7;
  element_type *__src;
  Vector *pVVar8;
  data_ptr_t pdVar9;
  ulong *puVar10;
  long lVar11;
  bool bVar12;
  anon_struct_16_3_d7536bce_for_pointer aVar13;
  string_t elem;
  Vector varchar_list;
  undefined1 local_f8 [8];
  element_type *peStack_f0;
  data_ptr_t local_d8;
  long local_d0;
  data_ptr_t local_c8;
  long local_c0;
  optional_idx local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  VVar1 = source->vector_type;
  index = (data_ptr_t)ArrayType::GetSize(&source->type);
  LogicalType::LogicalType((LogicalType *)local_f8,VARCHAR);
  optional_idx::optional_idx(&local_b8,(idx_t)index);
  LogicalType::ARRAY(&local_b0,(LogicalType *)local_f8,local_b8);
  Vector::Vector(&local_98,&local_b0,count);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::~LogicalType((LogicalType *)local_f8);
  ArrayToArrayCast(source,&local_98,count,parameters);
  Vector::Flatten(&local_98,count);
  FlatVector::VerifyFlatVector(&local_98);
  this = ArrayVector::GetEntry(&local_98);
  Vector::Flatten(this,count);
  FlatVector::VerifyFlatVector(this);
  if (count != 0) {
    puVar10 = (ulong *)this->data;
    pdVar9 = result->data;
    local_d0 = (long)index << 4;
    pdVar6 = (data_ptr_t)0x0;
    idx = 0;
    len = extraout_RDX;
    local_d8 = pdVar9;
    do {
      if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6] >>
           (idx & 0x3f) & 1) != 0)) {
        if (index == (data_ptr_t)0x0) {
          vector = (Vector *)0x2;
        }
        else {
          puVar2 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          vector = (Vector *)0x2;
          len = (data_ptr_t)0x0;
          puVar3 = puVar10;
          do {
            pVVar8 = (Vector *)&vector->field_0x2;
            if (len == (data_ptr_t)0x0) {
              pVVar8 = vector;
            }
            if (puVar2 == (unsigned_long *)0x0) {
              bVar12 = true;
            }
            else {
              bVar12 = (puVar2[(ulong)(pdVar6 + (long)len) >> 6] >>
                        ((ulong)(pdVar6 + (long)len) & 0x3f) & 1) != 0;
            }
            if (bVar12) {
              uVar7 = (ulong)(uint)*puVar3;
            }
            else {
              uVar7 = 4;
            }
            vector = (Vector *)(&pVVar8->vector_type + uVar7);
            len = len + 1;
            puVar3 = puVar3 + 2;
          } while (index != len);
        }
        aVar13 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)result,vector,(idx_t)len);
        local_c0 = idx * 0x10;
        len = pdVar9 + local_c0 + 4;
        pdVar5 = (data_ptr_t)aVar13.ptr;
        if (aVar13.length < 0xd) {
          pdVar5 = len;
        }
        ((anon_union_16_2_67f50693_for_value *)(len + -4))->pointer = aVar13;
        *pdVar5 = '[';
        local_c8 = len;
        if (index == (data_ptr_t)0x0) {
          lVar11 = 1;
        }
        else {
          lVar11 = 1;
          pdVar9 = (data_ptr_t)0x0;
          puVar3 = puVar10;
          do {
            local_f8 = (undefined1  [8])*puVar3;
            peStack_f0 = (element_type *)puVar3[1];
            if (pdVar9 != (data_ptr_t)0x0) {
              (pdVar5 + lVar11)[0] = ',';
              (pdVar5 + lVar11)[1] = ' ';
              lVar11 = lVar11 + 2;
            }
            puVar2 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar2 == (unsigned_long *)0x0) ||
               (len = (data_ptr_t)((ulong)(pdVar6 + (long)pdVar9) >> 6),
               (puVar2[(long)len] >> ((ulong)(pdVar6 + (long)pdVar9) & 0x3f) & 1) != 0)) {
              uVar7 = (ulong)local_f8 & 0xffffffff;
              __src = (element_type *)(local_f8 + 4);
              if (0xc < uVar7) {
                __src = peStack_f0;
              }
              switchD_015ff80e::default(pdVar5 + lVar11,__src,uVar7);
              len = extraout_RDX_00;
            }
            else {
              builtin_memcpy(pdVar5 + lVar11,"NULL",4);
              uVar7 = 4;
            }
            lVar11 = uVar7 + lVar11;
            pdVar9 = pdVar9 + 1;
            puVar3 = puVar3 + 2;
          } while (index != pdVar9);
        }
        pdVar9 = local_d8;
        puVar4 = (uint *)(local_d8 + local_c0);
        pdVar5[lVar11] = ']';
        uVar7 = (ulong)*puVar4;
        if (uVar7 < 0xd) {
          switchD_0105b559::default(local_c8 + uVar7,0,0xc - uVar7);
          len = extraout_RDX_01;
        }
        else {
          puVar4[1] = **(uint **)(puVar4 + 2);
        }
      }
      else {
        FlatVector::SetNull(result,idx,true);
        len = extraout_RDX_02;
      }
      idx = idx + 1;
      pdVar6 = pdVar6 + (long)index;
      puVar10 = (ulong *)((long)puVar10 + local_d0);
    } while (idx != count);
  }
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

static bool ArrayToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto is_constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;

	auto size = ArrayType::GetSize(source.GetType());
	Vector varchar_list(LogicalType::ARRAY(LogicalType::VARCHAR, size), count);
	ArrayToArrayCast(source, varchar_list, count, parameters);

	varchar_list.Flatten(count);
	auto &validity = FlatVector::Validity(varchar_list);
	auto &child = ArrayVector::GetEntry(varchar_list);

	child.Flatten(count);
	auto &child_validity = FlatVector::Validity(child);

	auto in_data = FlatVector::GetData<string_t>(child);
	auto out_data = FlatVector::GetData<string_t>(result);

	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		// First pass, compute the length
		idx_t array_varchar_length = 2;
		for (idx_t j = 0; j < size; j++) {
			auto elem_idx = (i * size) + j;
			auto elem = in_data[elem_idx];
			if (j > 0) {
				array_varchar_length += SEP_LENGTH;
			}
			array_varchar_length += child_validity.RowIsValid(elem_idx) ? elem.GetSize() : NULL_LENGTH;
		}

		out_data[i] = StringVector::EmptyString(result, array_varchar_length);
		auto dataptr = out_data[i].GetDataWriteable();
		idx_t offset = 0;
		dataptr[offset++] = '[';

		// Second pass, write the actual data
		for (idx_t j = 0; j < size; j++) {
			auto elem_idx = (i * size) + j;
			auto elem = in_data[elem_idx];
			if (j > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			if (child_validity.RowIsValid(elem_idx)) {
				auto len = elem.GetSize();
				memcpy(dataptr + offset, elem.GetData(), len);
				offset += len;
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset++] = ']';
		out_data[i].Finalize();
	}

	if (is_constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return true;
}